

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_session.cpp
# Opt level: O3

void __thiscall cab_session::~cab_session(cab_session *this)

{
  socket *this_00;
  _Atomic_word *p_Var1;
  _Manager_type p_Var2;
  pointer puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  cab_manager *this_01;
  ostream *poVar6;
  data_union local_94;
  address local_78;
  string local_58;
  endpoint_type local_34;
  
  if (this->_cab != (cab *)0x0) {
    this_01 = application::manager(this->_application);
    cab_manager::remove(this_01,(char *)this->_cab);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cab connection from ",0x14);
  this_00 = &this->_socket;
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::remote_endpoint((endpoint_type *)&local_94.base,
                    &this_00->
                     super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   );
  if (local_94.base.sa_family != 2) {
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_94.base.sa_data[6];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_94.base.sa_data[7];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_94.base.sa_data[8];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_94.base.sa_data[9];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_94.base.sa_data[10];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_94.base.sa_data[0xb];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_94.base.sa_data[0xc];
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_94.base.sa_data[0xd];
    local_78.ipv6_address_.addr_.__in6_u._8_8_ = local_94._16_8_;
    local_78.ipv6_address_.scope_id_ = (unsigned_long)local_94.v6.sin6_scope_id;
    local_94.v6.sin6_flowinfo = 0;
  }
  else {
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
    local_78.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
    local_78.ipv6_address_.addr_.__in6_u._8_8_ = 0;
    local_78.ipv6_address_.scope_id_ = 0;
  }
  local_78.type_ = (anon_enum_32)(local_94.base.sa_family != 2);
  local_78.ipv4_address_.addr_.s_addr = local_94.v4.sin_addr.s_addr;
  boost::asio::ip::address::to_string_abi_cxx11_(&local_58,&local_78);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
  boost::asio::
  basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::remote_endpoint(&local_34,
                    &this_00->
                     super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   );
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," closed\n",8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  p_Var2 = (this->_handle_buffer).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->_handle_buffer,(_Any_data *)&this->_handle_buffer,
              __destroy_functor);
  }
  puVar3 = (this->_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->_buffer).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)this_00);
  p_Var4 = (this->super_enable_shared_from_this<cab_session>)._M_weak_this.
           super___weak_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var4->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var4->_M_weak_count;
      p_Var4->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var4->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

cab_session::~cab_session()
{
    if(_cab)
        _application->manager().remove(*_cab);

    std::cout << "Cab connection from " << this->_socket.remote_endpoint().address().to_string()
              << ":" << this->_socket.remote_endpoint().port() << " closed\n";
}